

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::FindOffsets
               (FabArray<amrex::FArrayBox> *mf,string *filePrefix,Header *hdr,Version param_4,
               NFilesIter *nfi,MPI_Comm comm)

{
  _Rb_tree_color K;
  element_type *peVar1;
  long lVar2;
  Format FVar3;
  int iVar4;
  int iVar5;
  FABio *pFVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> *this;
  iterator iVar8;
  Long LVar9;
  pointer pVVar10;
  _Base_ptr p_Var11;
  long lVar12;
  int rank;
  long local_2d0;
  FabArray<amrex::FArrayBox> *local_2c8;
  long local_2c0;
  long local_2b8;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  Vector<int,_std::allocator<int>_> fileNumbers;
  Vector<long,_std::allocator<long>_> currentOffset;
  Vector<long,_std::allocator<long>_> fabHeaderBytes;
  string local_240;
  FArrayBox tempFab;
  string whichFileName;
  map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  rankBoxOrder;
  
  iVar5 = 0;
  if (nfi->useStaticSetSelection == false) {
    iVar5 = nfi->coordinatorProc;
  }
  FVar3 = FArrayBox::getFormat();
  if ((FVar3 != FAB_ASCII) && (FVar3 = FArrayBox::getFormat(), FVar3 != FAB_8BIT)) {
    FArrayBox::getDataDescriptor();
    pFVar6 = FArrayBox::getFABio();
    iVar4 = RealDescriptor::numBytes
                      ((RealDescriptor *)
                       whichRD._M_t.
                       super___uniq_ptr_impl<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::RealDescriptor_*,_std::default_delete<amrex::RealDescriptor>_>
                       .super__Head_base<0UL,_amrex::RealDescriptor_*,_false>._M_head_impl);
    if (iVar5 == 0) {
      local_2b8 = CONCAT44(local_2b8._4_4_,iVar4);
      local_2d0 = (long)(mf->super_FabArrayBase).n_comp;
      peVar1 = (mf->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      rankBoxOrder._M_t._M_impl._0_8_ = 0;
      std::vector<long,_std::allocator<long>_>::vector
                (&fabHeaderBytes.super_vector<long,_std::allocator<long>_>,
                 ((long)(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data) / 0x1c,(value_type_conflict3 *)&rankBoxOrder,
                 (allocator_type *)&tempFab);
      iVar5 = nOutFiles;
      if (*(int *)(ParallelContext::frames + 0x10) < nOutFiles) {
        iVar5 = *(int *)(ParallelContext::frames + 0x10);
      }
      iVar4 = 1;
      if (1 < iVar5) {
        iVar4 = iVar5;
      }
      local_2c0 = CONCAT44(local_2c0._4_4_,iVar4);
      whichFileName._M_dataplus._M_p = (pointer)&whichFileName.field_2;
      whichFileName._M_string_length = 0;
      whichFileName.field_2._M_local_buf[0] = '\0';
      rankBoxOrder._M_t._M_impl._0_8_ = 0;
      local_2c8 = mf;
      std::vector<long,_std::allocator<long>_>::vector
                (&currentOffset.super_vector<long,_std::allocator<long>_>,1,
                 (value_type_conflict3 *)&rankBoxOrder,(allocator_type *)&tempFab);
      if (hdr->m_vers == 1) {
        for (lVar12 = 0;
            peVar1 = (local_2c8->super_FabArrayBase).boxarray.m_ref.
                     super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            lVar12 < ((long)(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     *(long *)&(peVar1->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data) / 0x1c; lVar12 = lVar12 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&rankBoxOrder);
          FabArrayBase::fabbox((Box *)&local_240,&local_2c8->super_FabArrayBase,(int)lVar12);
          FArrayBox::FArrayBox
                    ((FArrayBox *)&tempFab.super_BaseFab<double>,(Box *)&local_240,(int)local_2d0,
                     false,false,(Arena *)0x0);
          (*pFVar6->_vptr_FABio[6])
                    (pFVar6,&rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     &tempFab.super_BaseFab<double>,(ulong)(uint)tempFab.super_BaseFab<double>.nvar)
          ;
          lVar7 = std::ostream::tellp();
          fabHeaderBytes.super_vector<long,_std::allocator<long>_>.
          super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
          [lVar12] = lVar7;
          BaseFab<double>::~BaseFab(&tempFab.super_BaseFab<double>);
          std::__cxx11::stringstream::~stringstream((stringstream *)&rankBoxOrder);
        }
      }
      rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header;
      rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           rankBoxOrder._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (tempFab.super_BaseFab<double>._vptr_BaseFab._0_4_ = 0;
          peVar1 = (local_2c8->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          (long)(int)tempFab.super_BaseFab<double>._vptr_BaseFab <
          ((long)(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c;
          tempFab.super_BaseFab<double>._vptr_BaseFab._0_4_ =
               (int)tempFab.super_BaseFab<double>._vptr_BaseFab + 1) {
        local_240._M_dataplus._M_p._0_4_ =
             *(undefined4 *)
              (*(long *)&(((local_2c8->super_FabArrayBase).distributionMap.m_ref.
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
              (long)(int)tempFab.super_BaseFab<double>._vptr_BaseFab * 4);
        this = &std::
                map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&rankBoxOrder,(key_type *)&local_240)->
                super_vector<int,_std::allocator<int>_>;
        std::vector<int,_std::allocator<int>_>::push_back(this,(value_type_conflict *)&tempFab);
      }
      fileNumbers.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      fileNumbers.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      fileNumbers.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      if (nfi->useStaticSetSelection == false) {
        NFilesIter::FileNumbersWritten((Vector<int,_std::allocator<int>_> *)&tempFab,nfi);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&fileNumbers.super_vector<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tempFab);
      }
      else if (nfi->useSparseFPP == true) {
        std::vector<int,_std::allocator<int>_>::resize
                  (&fileNumbers.super_vector<int,_std::allocator<int>_>,1);
        *fileNumbers.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize
                  (&fileNumbers.super_vector<int,_std::allocator<int>_>,1);
        iVar5 = NFilesIter::FileNumber((int)local_2c0,0,(bool)groupSets);
        *fileNumbers.super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             iVar5;
      }
      local_2d0 = local_2d0 * (int)local_2b8;
      pVVar10 = (nfi->fileNumbersWriteOrder).
                super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                .
                super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar12 = 0;
          lVar12 < ((long)(nfi->fileNumbersWriteOrder).
                          super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10) / 0x18;
          lVar12 = lVar12 + 1) {
        local_2c0 = lVar12 * 0x18;
        lVar7 = 0;
        while (lVar2 = *(long *)((long)&(pVVar10->super_vector<int,_std::allocator<int>_>).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + local_2c0),
              lVar7 < *(long *)((long)&(pVVar10->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish + local_2c0) - lVar2 >> 2)
        {
          rank = *(int *)(lVar2 + lVar7 * 4);
          local_2b8 = lVar7;
          iVar8 = std::
                  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&rankBoxOrder._M_t,&rank);
          if ((_Rb_tree_header *)iVar8._M_node != &rankBoxOrder._M_t._M_impl.super__Rb_tree_header)
          {
            iVar5 = fileNumbers.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[rank];
            NFilesIter::FileName(&local_240,iVar5,filePrefix);
            BaseName((string *)&tempFab,&local_240);
            std::__cxx11::string::operator=((string *)&whichFileName,(string *)&tempFab);
            std::__cxx11::string::~string((string *)&tempFab);
            std::__cxx11::string::~string((string *)&local_240);
            p_Var11 = iVar8._M_node[1]._M_parent;
            for (lVar7 = 0; lVar7 < (long)iVar8._M_node[1]._M_left - (long)p_Var11 >> 2;
                lVar7 = lVar7 + 1) {
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((hdr->m_fod).
                          super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                          .
                          super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                         (int)(&p_Var11->_M_color)[lVar7]));
              K = (&(iVar8._M_node[1]._M_parent)->_M_color)[lVar7];
              (hdr->m_fod).
              super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
              super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
              _M_impl.super__Vector_impl_data._M_start[(int)K].m_head =
                   currentOffset.super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start[iVar5];
              FabArrayBase::fabbox((Box *)&tempFab,&local_2c8->super_FabArrayBase,K);
              LVar9 = Box::numPts((Box *)&tempFab);
              p_Var11 = iVar8._M_node[1]._M_parent;
              currentOffset.super_vector<long,_std::allocator<long>_>.
              super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar5] =
                   currentOffset.super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start[iVar5] +
                   LVar9 * local_2d0 +
                   fabHeaderBytes.super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start[(int)(&p_Var11->_M_color)[lVar7]];
            }
          }
          pVVar10 = (nfi->fileNumbersWriteOrder).
                    super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = local_2b8 + 1;
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&fileNumbers);
      std::
      _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&rankBoxOrder._M_t);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&currentOffset);
      std::__cxx11::string::~string((string *)&whichFileName);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                ((_Vector_base<long,_std::allocator<long>_> *)&fabHeaderBytes);
    }
    std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::~unique_ptr
              (&whichRD);
  }
  return;
}

Assistant:

void
VisMF::FindOffsets (const FabArray<FArrayBox> &mf,
                    const std::string &filePrefix,
                    VisMF::Header &hdr,
                    VisMF::Header::Version /*whichVersion*/,
                    NFilesIter &nfi, MPI_Comm comm)
{
//    BL_PROFILE("VisMF::FindOffsets");

    const int myProc(ParallelDescriptor::MyProc(comm));
    const int nProcs(ParallelDescriptor::NProcs(comm));
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber(comm));
    if(nfi.GetDynamic()) {
      coordinatorProc = nfi.CoordinatorProc();
    }

    if(FArrayBox::getFormat() == FABio::FAB_ASCII ||
       FArrayBox::getFormat() == FABio::FAB_8BIT)
    {

#ifdef BL_USE_MPI
    Vector<int> nmtags(nProcs,0);
    Vector<int> offset(nProcs,0);

    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();

    for(int i(0), N(mf.size()); i < N; ++i) {
        ++nmtags[pmap[i]];
    }

    for(int i(1), N(offset.size()); i < N; ++i) {
        offset[i] = offset[i-1] + nmtags[i-1];
    }

    Vector<Long> senddata(nmtags[myProc]);

    if(senddata.empty()) {
      // Can't let senddata be empty as senddata.dataPtr() will fail.
      senddata.resize(1);
    }

    int ioffset(0);

    for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
      senddata[ioffset++] = hdr.m_fod[mfi.index()].m_head;
    }

    BL_ASSERT(ioffset == nmtags[myProc]);

    Vector<Long> recvdata(mf.size());

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::BeforeCall());

    BL_MPI_REQUIRE( MPI_Gatherv(senddata.dataPtr(),
                                nmtags[myProc],
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                recvdata.dataPtr(),
                                nmtags.dataPtr(),
                                offset.dataPtr(),
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                coordinatorProc,
                                comm) );

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::AfterCall());

    if(myProc == coordinatorProc) {
        Vector<int> cnt(nProcs,0);

        for(int j(0), N(mf.size()); j < N; ++j) {
            const int i(pmap[j]);
            hdr.m_fod[j].m_head = recvdata[offset[i]+cnt[i]];

            const std::string name(NFilesIter::FileName(nOutFiles, filePrefix, i, groupSets));

            hdr.m_fod[j].m_name = VisMF::BaseName(name);

            ++cnt[i];
        }
    }
#endif /*BL_USE_MPI*/


    } else {    // ---- calculate offsets

      auto whichRD = FArrayBox::getDataDescriptor();
      const FABio &fio = FArrayBox::getFABio();
      int whichRDBytes(whichRD->numBytes());
      int nComps(mf.nComp());

      if(myProc == coordinatorProc) {   // ---- calculate offsets
        const BoxArray &mfBA = mf.boxArray();
        const DistributionMapping &mfDM = mf.DistributionMap();
        Vector<Long> fabHeaderBytes(mfBA.size(), 0);
        int nFiles(NFilesIter::ActualNFiles(nOutFiles));
        int whichFileNumber(-1);
        std::string whichFileName;
        Vector<Long> currentOffset(nProcs, 0L);

        if(hdr.m_vers == VisMF::Header::Version_v1) {
          // ---- find the length of the fab header instead of asking the file system
          for(int i(0); i < mfBA.size(); ++i) {
            std::stringstream hss;
            FArrayBox tempFab(mf.fabbox(i), nComps, false);  // ---- no alloc
            fio.write_header(hss, tempFab, tempFab.nComp());
            fabHeaderBytes[i] = static_cast<std::streamoff>(hss.tellp());
          }
        }

        std::map<int, Vector<int> > rankBoxOrder;  // ---- [rank, boxarray index array]
        for(int i(0); i < mfBA.size(); ++i) {
          rankBoxOrder[mfDM[i]].push_back(i);
        }

        Vector<int> fileNumbers;
        if(nfi.GetDynamic()) {
          fileNumbers = nfi.FileNumbersWritten();
        }
        else if(nfi.GetSparseFPP()) {        // if sparse, write to (file number = rank)
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = i;
          }
        }
        else {
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = NFilesIter::FileNumber(nFiles, i, groupSets);
          }
        }

        const Vector< Vector<int> > &fileNumbersWriteOrder = nfi.FileNumbersWriteOrder();

        for(int fn(0); fn < fileNumbersWriteOrder.size(); ++fn) {
          for(int ri(0); ri < fileNumbersWriteOrder[fn].size(); ++ri) {
            int rank(fileNumbersWriteOrder[fn][ri]);
            std::map<int, Vector<int> >::iterator rboIter = rankBoxOrder.find(rank);

            if(rboIter != rankBoxOrder.end()) {
              Vector<int> &index = rboIter->second;
              whichFileNumber = fileNumbers[rank];
              whichFileName   = VisMF::BaseName(NFilesIter::FileName(whichFileNumber, filePrefix));

              for(int i(0); i < index.size(); ++i) {
                 hdr.m_fod[index[i]].m_name = whichFileName;
                 hdr.m_fod[index[i]].m_head = currentOffset[whichFileNumber];
                 currentOffset[whichFileNumber] += mf.fabbox(index[i]).numPts() * nComps * whichRDBytes
                                                   + fabHeaderBytes[index[i]];
              }
            }
          }
        }
      }
    }
}